

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglwidget.cpp
# Opt level: O2

void __thiscall QOpenGLWidget::QOpenGLWidget(QOpenGLWidget *this,QWidget *parent,WindowFlags f)

{
  QWidgetPrivate *this_00;
  char cVar1;
  QOpenGLWidgetPrivate *this_01;
  long in_FS_OFFSET;
  char local_48 [24];
  char *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = (QOpenGLWidgetPrivate *)operator_new(0x2c0);
  QOpenGLWidgetPrivate::QOpenGLWidgetPrivate(this_01);
  QWidget::QWidget(&this->super_QWidget,this_01,parent,
                   f.super_QFlagsStorageHelper<Qt::WindowType,_4>.
                   super_QFlagsStorage<Qt::WindowType>.i);
  *(undefined ***)this = &PTR_metaObject_0010d430;
  *(undefined ***)&this->field_0x10 = &PTR__QOpenGLWidget_0010d5f8;
  this_00 = *(QWidgetPrivate **)&this->field_0x8;
  cVar1 = (**(code **)(*QGuiApplicationPrivate::platform_integration + 0x10))
                    (QGuiApplicationPrivate::platform_integration,0x17);
  if (cVar1 != '\0') {
    cVar1 = (**(code **)(*QGuiApplicationPrivate::platform_integration + 0x10))
                      (QGuiApplicationPrivate::platform_integration,2);
    if (cVar1 != '\0') {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        QWidgetPrivate::setRenderToTexture(this_00);
        return;
      }
      goto LAB_0010877b;
    }
  }
  local_48[0] = '\x02';
  local_48[1] = '\0';
  local_48[2] = '\0';
  local_48[3] = '\0';
  local_48[0x14] = '\0';
  local_48[0x15] = '\0';
  local_48[0x16] = '\0';
  local_48[0x17] = '\0';
  local_48[4] = '\0';
  local_48[5] = '\0';
  local_48[6] = '\0';
  local_48[7] = '\0';
  local_48[8] = '\0';
  local_48[9] = '\0';
  local_48[10] = '\0';
  local_48[0xb] = '\0';
  local_48[0xc] = '\0';
  local_48[0xd] = '\0';
  local_48[0xe] = '\0';
  local_48[0xf] = '\0';
  local_48[0x10] = '\0';
  local_48[0x11] = '\0';
  local_48[0x12] = '\0';
  local_48[0x13] = '\0';
  local_30 = "default";
  QMessageLogger::warning(local_48,"QOpenGLWidget is not supported on this platform.");
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
LAB_0010877b:
  __stack_chk_fail();
}

Assistant:

QOpenGLWidget::QOpenGLWidget(QWidget *parent, Qt::WindowFlags f)
    : QWidget(*(new QOpenGLWidgetPrivate), parent, f)
{
    Q_D(QOpenGLWidget);
    if (Q_UNLIKELY(!QGuiApplicationPrivate::platformIntegration()->hasCapability(QPlatformIntegration::RhiBasedRendering)
                   || !QGuiApplicationPrivate::platformIntegration()->hasCapability(QPlatformIntegration::OpenGL)))
        qWarning("QOpenGLWidget is not supported on this platform.");
    else
        d->setRenderToTexture();
}